

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::verifyPixelsAreEqual<Imath_3_2::half>
               (DeepImageChannel *c1,DeepImageChannel *c2,int dx,int dy)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ImageLevel *this;
  Box2i *pBVar4;
  DeepImageLevel *pDVar5;
  uint *puVar6;
  ArgExc *pAVar7;
  int in_EDX;
  undefined8 in_RSI;
  ImageChannel *in_RDI;
  float fVar8;
  int i;
  half *s2;
  half *s1;
  int n2;
  int n1;
  int x;
  int y;
  SampleCountChannel *scc2;
  SampleCountChannel *scc1;
  Box2i *dataWindow;
  TypedDeepImageChannel<Imath_3_2::half> *tc2;
  TypedDeepImageChannel<Imath_3_2::half> *tc1;
  half *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  SampleCountChannel *in_stack_ffffffffffffff70;
  int local_74;
  int local_48;
  int local_44;
  
  lVar2 = __dynamic_cast(in_RDI,&Imf_3_4::DeepImageChannel::typeinfo,
                         &Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  lVar3 = __dynamic_cast(in_RSI,&Imf_3_4::DeepImageChannel::typeinfo,
                         &Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::typeinfo,0);
  if (lVar3 == 0) {
    __cxa_bad_cast();
  }
  this = Imf_3_4::ImageChannel::level(in_RDI);
  pBVar4 = Imf_3_4::ImageLevel::dataWindow(this);
  pDVar5 = (DeepImageLevel *)Imf_3_4::DeepImageChannel::deepLevel();
  Imf_3_4::DeepImageLevel::sampleCounts(pDVar5);
  pDVar5 = (DeepImageLevel *)Imf_3_4::DeepImageChannel::deepLevel();
  Imf_3_4::DeepImageLevel::sampleCounts(pDVar5);
  local_44 = (pBVar4->min).y;
  do {
    if ((pBVar4->max).y < local_44) {
      return;
    }
    for (local_48 = (pBVar4->min).x; local_48 <= (pBVar4->max).x; local_48 = local_48 + 1) {
      puVar6 = Imf_3_4::SampleCountChannel::at
                         (in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68);
      uVar1 = *puVar6;
      puVar6 = Imf_3_4::SampleCountChannel::at
                         (in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68);
      if (uVar1 != *puVar6) {
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar7,"different pixel sample counts");
        __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::at((int)lVar2,local_48);
      Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::at((int)lVar3,local_48 + in_EDX);
      for (local_74 = 0; local_74 < (int)uVar1; local_74 = local_74 + 1) {
        in_stack_ffffffffffffff6c =
             Imath_3_2::half::operator_cast_to_float(in_stack_ffffffffffffff60);
        fVar8 = Imath_3_2::half::operator_cast_to_float(in_stack_ffffffffffffff60);
        if ((in_stack_ffffffffffffff6c != fVar8) || (NAN(in_stack_ffffffffffffff6c) || NAN(fVar8)))
        {
          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar7,"different sample values");
          __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual (
    const DeepImageChannel& c1, const DeepImageChannel& c2, int dx, int dy)
{
    const TypedDeepImageChannel<T>& tc1 =
        dynamic_cast<const TypedDeepImageChannel<T>&> (c1);

    const TypedDeepImageChannel<T>& tc2 =
        dynamic_cast<const TypedDeepImageChannel<T>&> (c2);

    const Box2i&              dataWindow = c1.level ().dataWindow ();
    const SampleCountChannel& scc1       = c1.deepLevel ().sampleCounts ();
    const SampleCountChannel& scc2       = c2.deepLevel ().sampleCounts ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n1 = scc1.at (x, y);
            int n2 = scc2.at (x + dx, y + dy);

            if (n1 != n2) throw ArgExc ("different pixel sample counts");

            const T* s1 = tc1.at (x, y);
            const T* s2 = tc2.at (x + dx, y + dy);

            for (int i = 0; i < n1; ++i)
                if (s1[i] != s2[i]) throw ArgExc ("different sample values");
        }
    }
}